

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralSurfaceMemberVarying::~IfcStructuralSurfaceMemberVarying
          (IfcStructuralSurfaceMemberVarying *this)

{
  IfcStructuralSurfaceMember *this_00;
  long lVar1;
  void *pvVar2;
  
  lVar1 = *(long *)(*(long *)&(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.
                              super_IfcStructuralItem.super_IfcProduct.super_IfcObject + -0x18);
  this_00 = (IfcStructuralSurfaceMember *)
            (&(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.
              super_IfcStructuralItem.super_IfcProduct.super_IfcObject.field_0x0 + lVar1);
  *(undefined8 *)
   (&(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.super_IfcStructuralItem.
     super_IfcProduct.super_IfcObject.field_0x0 + lVar1) = 0x893c40;
  *(undefined8 *)(&this->field_0x190 + lVar1) = 0x893d80;
  *(undefined8 *)
   (&(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.super_IfcStructuralItem.
     super_IfcProduct.super_IfcObject.field_0x88 + lVar1) = 0x893c68;
  *(undefined8 *)
   ((long)&(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.
           super_IfcStructuralItem.super_IfcProduct.super_IfcObject.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper + lVar1) =
       0x893c90;
  *(undefined8 *)
   (&(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.super_IfcStructuralItem.
     super_IfcProduct.super_IfcObject.field_0xd0 + lVar1) = 0x893cb8;
  *(undefined8 *)
   (&(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.super_IfcStructuralItem.
     super_IfcProduct.field_0x100 + lVar1) = 0x893ce0;
  *(undefined8 *)
   (&(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.super_IfcStructuralItem.
     super_IfcProduct.field_0x110 + lVar1) = 0x893d08;
  *(undefined8 *)
   (&(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.super_IfcStructuralItem.
     field_0x120 + lVar1) = 0x893d30;
  *(undefined8 *)(&(this->super_IfcStructuralSurfaceMember).field_0x160 + lVar1) = 0x893d58;
  pvVar2 = *(void **)(&(this->super_IfcStructuralSurfaceMember).field_0x170 + lVar1);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,*(long *)&this_00[1].super_IfcStructuralMember.super_IfcStructuralItem.
                                     super_IfcProduct.super_IfcObject.field_0x8 - (long)pvVar2);
  }
  IfcStructuralSurfaceMember::~IfcStructuralSurfaceMember
            (this_00,&PTR_construction_vtable_24__00893d98);
  return;
}

Assistant:

IfcStructuralSurfaceMemberVarying() : Object("IfcStructuralSurfaceMemberVarying") {}